

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void cftb1st(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double y3i;
  double y3r;
  double y2i;
  double y2r;
  double y1i;
  double y1r;
  double y0i;
  double y0r;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wd3i;
  double wd3r;
  double wd1i;
  double wd1r;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double csc3;
  double csc1;
  double wn4r;
  int mh;
  int m;
  int k;
  int j3;
  int j2;
  int j1;
  int j0;
  int j;
  double *w_local;
  double *a_local;
  int n_local;
  
  iVar29 = n >> 3;
  iVar30 = iVar29 * 2;
  iVar31 = iVar29 * 4;
  iVar32 = iVar29 * 6;
  dVar46 = *a;
  dVar43 = a[iVar31];
  dVar45 = a[1];
  dVar40 = a[iVar31 + 1];
  dVar41 = *a;
  dVar1 = a[iVar31];
  dVar2 = a[1];
  dVar3 = a[iVar31 + 1];
  dVar4 = a[iVar30];
  dVar5 = a[iVar32];
  dVar6 = a[iVar30 + 1];
  dVar7 = a[iVar32 + 1];
  dVar8 = a[iVar30];
  dVar9 = a[iVar32];
  dVar10 = a[iVar30 + 1];
  dVar11 = a[iVar32 + 1];
  *a = dVar46 + dVar43 + dVar4 + dVar5;
  a[1] = (-dVar45 - dVar40) - (dVar6 + dVar7);
  a[iVar30] = (dVar46 + dVar43) - (dVar4 + dVar5);
  a[iVar30 + 1] = (-dVar45 - dVar40) + dVar6 + dVar7;
  a[iVar31] = (dVar41 - dVar1) + (dVar10 - dVar11);
  a[iVar31 + 1] = -dVar2 + dVar3 + (dVar8 - dVar9);
  a[iVar32] = (dVar41 - dVar1) - (dVar10 - dVar11);
  a[iVar32 + 1] = (-dVar2 + dVar3) - (dVar8 - dVar9);
  dVar46 = w[1];
  dVar43 = w[2];
  dVar45 = w[3];
  wd1i = 1.0;
  wd3r = 0.0;
  wd3i = 1.0;
  x0r = 0.0;
  mh = 0;
  for (j1 = 2; j1 < iVar29 + -2; j1 = j1 + 4) {
    iVar31 = mh + 4;
    dVar36 = dVar43 * (wd1i + w[iVar31]);
    dVar37 = dVar43 * (wd3r + w[mh + 5]);
    dVar38 = dVar45 * (wd3i + w[mh + 6]);
    dVar39 = dVar45 * (x0r + w[mh + 7]);
    wd1i = w[iVar31];
    wd3r = w[mh + 5];
    wd3i = w[mh + 6];
    x0r = w[mh + 7];
    iVar32 = j1 + iVar30;
    iVar33 = iVar32 + iVar30;
    iVar34 = iVar33 + iVar30;
    dVar40 = a[j1];
    dVar41 = a[iVar33];
    dVar1 = a[j1 + 1];
    dVar2 = a[iVar33 + 1];
    dVar3 = a[j1];
    dVar4 = a[iVar33];
    dVar5 = a[j1 + 1];
    dVar6 = a[iVar33 + 1];
    dVar7 = a[j1 + 2];
    dVar8 = a[iVar33 + 2];
    dVar9 = a[j1 + 3];
    dVar10 = a[iVar33 + 3];
    dVar11 = a[j1 + 2];
    dVar12 = a[iVar33 + 2];
    dVar13 = a[j1 + 3];
    dVar14 = a[iVar33 + 3];
    dVar42 = a[iVar32];
    dVar44 = a[iVar34];
    dVar15 = a[iVar32 + 1];
    dVar16 = a[iVar34 + 1];
    dVar17 = a[iVar32];
    dVar18 = a[iVar34];
    dVar19 = a[iVar32 + 1];
    dVar20 = a[iVar34 + 1];
    dVar21 = a[iVar32 + 2];
    dVar22 = a[iVar34 + 2];
    dVar23 = a[iVar32 + 3];
    dVar24 = a[iVar34 + 3];
    dVar25 = a[iVar32 + 2];
    dVar26 = a[iVar34 + 2];
    dVar27 = a[iVar32 + 3];
    dVar28 = a[iVar34 + 3];
    a[j1] = dVar40 + dVar41 + dVar42 + dVar44;
    a[j1 + 1] = (-dVar1 - dVar2) - (dVar15 + dVar16);
    a[j1 + 2] = dVar7 + dVar8 + dVar21 + dVar22;
    a[j1 + 3] = (-dVar9 - dVar10) - (dVar23 + dVar24);
    a[iVar32] = (dVar40 + dVar41) - (dVar42 + dVar44);
    a[iVar32 + 1] = (-dVar1 - dVar2) + dVar15 + dVar16;
    a[iVar32 + 2] = (dVar7 + dVar8) - (dVar21 + dVar22);
    a[iVar32 + 3] = (-dVar9 - dVar10) + dVar23 + dVar24;
    dVar40 = (dVar3 - dVar4) + (dVar19 - dVar20);
    dVar41 = -dVar5 + dVar6 + (dVar17 - dVar18);
    a[iVar33] = dVar36 * dVar40 + -(dVar37 * dVar41);
    a[iVar33 + 1] = dVar36 * dVar41 + dVar37 * dVar40;
    dVar40 = (dVar11 - dVar12) + (dVar27 - dVar28);
    dVar41 = -dVar13 + dVar14 + (dVar25 - dVar26);
    a[iVar33 + 2] = wd1i * dVar40 + -(wd3r * dVar41);
    a[iVar33 + 3] = wd1i * dVar41 + wd3r * dVar40;
    dVar40 = (dVar3 - dVar4) - (dVar19 - dVar20);
    dVar41 = (-dVar5 + dVar6) - (dVar17 - dVar18);
    a[iVar34] = dVar38 * dVar40 + dVar39 * dVar41;
    a[iVar34 + 1] = dVar38 * dVar41 + -(dVar39 * dVar40);
    dVar40 = (dVar11 - dVar12) - (dVar27 - dVar28);
    dVar41 = (-dVar13 + dVar14) - (dVar25 - dVar26);
    a[iVar34 + 2] = wd3i * dVar40 + x0r * dVar41;
    a[iVar34 + 3] = wd3i * dVar41 + -(x0r * dVar40);
    iVar32 = iVar30 - j1;
    iVar33 = iVar32 + iVar30;
    iVar34 = iVar33 + iVar30;
    iVar35 = iVar34 + iVar30;
    dVar40 = a[iVar32];
    dVar41 = a[iVar34];
    dVar1 = a[iVar32 + 1];
    dVar2 = a[iVar34 + 1];
    dVar3 = a[iVar32];
    dVar4 = a[iVar34];
    dVar5 = a[iVar32 + 1];
    dVar6 = a[iVar34 + 1];
    dVar7 = a[iVar32 + -2];
    dVar8 = a[iVar34 + -2];
    dVar9 = a[iVar32 + -1];
    dVar10 = a[iVar34 + -1];
    dVar11 = a[iVar32 + -2];
    dVar12 = a[iVar34 + -2];
    dVar13 = a[iVar32 + -1];
    dVar14 = a[iVar34 + -1];
    dVar42 = a[iVar33];
    dVar44 = a[iVar35];
    dVar15 = a[iVar33 + 1];
    dVar16 = a[iVar35 + 1];
    dVar17 = a[iVar33];
    dVar18 = a[iVar35];
    dVar19 = a[iVar33 + 1];
    dVar20 = a[iVar35 + 1];
    dVar21 = a[iVar33 + -2];
    dVar22 = a[iVar35 + -2];
    dVar23 = a[iVar33 + -1];
    dVar24 = a[iVar35 + -1];
    dVar25 = a[iVar33 + -2];
    dVar26 = a[iVar35 + -2];
    dVar27 = a[iVar33 + -1];
    dVar28 = a[iVar35 + -1];
    a[iVar32] = dVar40 + dVar41 + dVar42 + dVar44;
    a[iVar32 + 1] = (-dVar1 - dVar2) - (dVar15 + dVar16);
    a[iVar32 + -2] = dVar7 + dVar8 + dVar21 + dVar22;
    a[iVar32 + -1] = (-dVar9 - dVar10) - (dVar23 + dVar24);
    a[iVar33] = (dVar40 + dVar41) - (dVar42 + dVar44);
    a[iVar33 + 1] = (-dVar1 - dVar2) + dVar15 + dVar16;
    a[iVar33 + -2] = (dVar7 + dVar8) - (dVar21 + dVar22);
    a[iVar33 + -1] = (-dVar9 - dVar10) + dVar23 + dVar24;
    dVar40 = (dVar3 - dVar4) + (dVar19 - dVar20);
    dVar41 = -dVar5 + dVar6 + (dVar17 - dVar18);
    a[iVar34] = dVar37 * dVar40 + -(dVar36 * dVar41);
    a[iVar34 + 1] = dVar37 * dVar41 + dVar36 * dVar40;
    dVar40 = (dVar11 - dVar12) + (dVar27 - dVar28);
    dVar41 = -dVar13 + dVar14 + (dVar25 - dVar26);
    a[iVar34 + -2] = wd3r * dVar40 + -(wd1i * dVar41);
    a[iVar34 + -1] = wd3r * dVar41 + wd1i * dVar40;
    dVar40 = (dVar3 - dVar4) - (dVar19 - dVar20);
    dVar41 = (-dVar5 + dVar6) - (dVar17 - dVar18);
    a[iVar35] = dVar39 * dVar40 + dVar38 * dVar41;
    a[iVar35 + 1] = dVar39 * dVar41 + -(dVar38 * dVar40);
    dVar40 = (dVar11 - dVar12) - (dVar27 - dVar28);
    dVar41 = (-dVar13 + dVar14) - (dVar25 - dVar26);
    a[iVar35 + -2] = x0r * dVar40 + wd3i * dVar41;
    a[iVar35 + -1] = x0r * dVar41 + -(wd3i * dVar40);
    mh = iVar31;
  }
  dVar42 = dVar43 * (wd1i + dVar46);
  dVar43 = dVar43 * (wd3r + dVar46);
  dVar44 = dVar45 * (wd3i - dVar46);
  dVar45 = dVar45 * (x0r - dVar46);
  iVar31 = iVar29 * 3;
  iVar32 = iVar29 * 5;
  iVar30 = iVar29 * 7;
  dVar40 = a[iVar29 + -2];
  dVar41 = a[iVar32 + -2];
  dVar1 = a[iVar29 + -1];
  dVar2 = a[iVar32 + -1];
  dVar3 = a[iVar29 + -2];
  dVar4 = a[iVar32 + -2];
  dVar5 = a[iVar29 + -1];
  dVar6 = a[iVar32 + -1];
  dVar7 = a[iVar31 + -2];
  dVar8 = a[iVar30 + -2];
  dVar9 = a[iVar31 + -1];
  dVar10 = a[iVar30 + -1];
  dVar11 = a[iVar31 + -2];
  dVar12 = a[iVar30 + -2];
  dVar13 = a[iVar31 + -1];
  dVar14 = a[iVar30 + -1];
  a[iVar29 + -2] = dVar40 + dVar41 + dVar7 + dVar8;
  a[iVar29 + -1] = (-dVar1 - dVar2) - (dVar9 + dVar10);
  a[iVar31 + -2] = (dVar40 + dVar41) - (dVar7 + dVar8);
  a[iVar31 + -1] = (-dVar1 - dVar2) + dVar9 + dVar10;
  dVar40 = (dVar3 - dVar4) + (dVar13 - dVar14);
  dVar41 = -dVar5 + dVar6 + (dVar11 - dVar12);
  a[iVar32 + -2] = dVar42 * dVar40 + -(dVar43 * dVar41);
  a[iVar32 + -1] = dVar42 * dVar41 + dVar43 * dVar40;
  dVar40 = (dVar3 - dVar4) - (dVar13 - dVar14);
  dVar41 = (-dVar5 + dVar6) - (dVar11 - dVar12);
  a[iVar30 + -2] = dVar44 * dVar40 + dVar45 * dVar41;
  a[iVar30 + -1] = dVar44 * dVar41 + -(dVar45 * dVar40);
  dVar40 = a[iVar29];
  dVar41 = a[iVar32];
  dVar1 = a[iVar29 + 1];
  dVar2 = a[iVar32 + 1];
  dVar3 = a[iVar29];
  dVar4 = a[iVar32];
  dVar5 = a[iVar29 + 1];
  dVar6 = a[iVar32 + 1];
  dVar7 = a[iVar31];
  dVar8 = a[iVar30];
  dVar9 = a[iVar31 + 1];
  dVar10 = a[iVar30 + 1];
  dVar11 = a[iVar31];
  dVar12 = a[iVar30];
  dVar13 = a[iVar31 + 1];
  dVar14 = a[iVar30 + 1];
  a[iVar29] = dVar40 + dVar41 + dVar7 + dVar8;
  a[iVar29 + 1] = (-dVar1 - dVar2) - (dVar9 + dVar10);
  a[iVar31] = (dVar40 + dVar41) - (dVar7 + dVar8);
  a[iVar31 + 1] = (-dVar1 - dVar2) + dVar9 + dVar10;
  dVar40 = (dVar3 - dVar4) + (dVar13 - dVar14);
  dVar41 = -dVar5 + dVar6 + (dVar11 - dVar12);
  a[iVar32] = dVar46 * (dVar40 - dVar41);
  a[iVar32 + 1] = dVar46 * (dVar41 + dVar40);
  dVar40 = (dVar3 - dVar4) - (dVar13 - dVar14);
  dVar41 = (-dVar5 + dVar6) - (dVar11 - dVar12);
  a[iVar30] = -dVar46 * (dVar40 + dVar41);
  a[iVar30 + 1] = -dVar46 * (dVar41 - dVar40);
  dVar46 = a[iVar29 + 2];
  dVar40 = a[iVar32 + 2];
  dVar41 = a[iVar29 + 3];
  dVar1 = a[iVar32 + 3];
  dVar2 = a[iVar29 + 2];
  dVar3 = a[iVar32 + 2];
  dVar4 = a[iVar29 + 3];
  dVar5 = a[iVar32 + 3];
  dVar6 = a[iVar31 + 2];
  dVar7 = a[iVar30 + 2];
  dVar8 = a[iVar31 + 3];
  dVar9 = a[iVar30 + 3];
  dVar10 = a[iVar31 + 2];
  dVar11 = a[iVar30 + 2];
  dVar12 = a[iVar31 + 3];
  dVar13 = a[iVar30 + 3];
  a[iVar29 + 2] = dVar46 + dVar40 + dVar6 + dVar7;
  a[iVar29 + 3] = (-dVar41 - dVar1) - (dVar8 + dVar9);
  a[iVar31 + 2] = (dVar46 + dVar40) - (dVar6 + dVar7);
  a[iVar31 + 3] = (-dVar41 - dVar1) + dVar8 + dVar9;
  dVar46 = (dVar2 - dVar3) + (dVar12 - dVar13);
  dVar40 = -dVar4 + dVar5 + (dVar10 - dVar11);
  a[iVar32 + 2] = dVar43 * dVar46 + -(dVar42 * dVar40);
  a[iVar32 + 3] = dVar43 * dVar40 + dVar42 * dVar46;
  dVar46 = (dVar2 - dVar3) - (dVar12 - dVar13);
  dVar43 = (-dVar4 + dVar5) - (dVar10 - dVar11);
  a[iVar30 + 2] = dVar45 * dVar46 + dVar44 * dVar43;
  a[iVar30 + 3] = dVar45 * dVar43 + -(dVar44 * dVar46);
  return;
}

Assistant:

void cftb1st(int n, FFTFLT *a, FFTFLT *w)
{
    int j, j0, j1, j2, j3, k, m, mh;
    FFTFLT wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
        wd1r, wd1i, wd3r, wd3i;
    FFTFLT x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

    mh = n >> 3;
    m = 2 * mh;
    j1 = m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[0] + a[j2];
    x0i = -a[1] - a[j2 + 1];
    x1r = a[0] - a[j2];
    x1i = -a[1] + a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[0] = x0r + x2r;
    a[1] = x0i - x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j2] = x1r + x3i;
    a[j2 + 1] = x1i + x3r;
    a[j3] = x1r - x3i;
    a[j3 + 1] = x1i - x3r;
    wn4r = w[1];
    csc1 = w[2];
    csc3 = w[3];
    wd1r = 1;
    wd1i = 0;
    wd3r = 1;
    wd3i = 0;
    k = 0;
    for (j = 2; j < mh - 2; j += 4) {
        k += 4;
        wk1r = csc1 * (wd1r + w[k]);
        wk1i = csc1 * (wd1i + w[k + 1]);
        wk3r = csc3 * (wd3r + w[k + 2]);
        wk3i = csc3 * (wd3i + w[k + 3]);
        wd1r = w[k];
        wd1i = w[k + 1];
        wd3r = w[k + 2];
        wd3i = w[k + 3];
        j1 = j + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j] + a[j2];
        x0i = -a[j + 1] - a[j2 + 1];
        x1r = a[j] - a[j2];
        x1i = -a[j + 1] + a[j2 + 1];
        y0r = a[j + 2] + a[j2 + 2];
        y0i = -a[j + 3] - a[j2 + 3];
        y1r = a[j + 2] - a[j2 + 2];
        y1i = -a[j + 3] + a[j2 + 3];
        x2r = a[j1] + a[j3];
        x2i = a[j1 + 1] + a[j3 + 1];
        x3r = a[j1] - a[j3];
        x3i = a[j1 + 1] - a[j3 + 1];
        y2r = a[j1 + 2] + a[j3 + 2];
        y2i = a[j1 + 3] + a[j3 + 3];
        y3r = a[j1 + 2] - a[j3 + 2];
        y3i = a[j1 + 3] - a[j3 + 3];
        a[j] = x0r + x2r;
        a[j + 1] = x0i - x2i;
        a[j + 2] = y0r + y2r;
        a[j + 3] = y0i - y2i;
        a[j1] = x0r - x2r;
        a[j1 + 1] = x0i + x2i;
        a[j1 + 2] = y0r - y2r;
        a[j1 + 3] = y0i + y2i;
        x0r = x1r + x3i;
        x0i = x1i + x3r;
        a[j2] = wk1r * x0r - wk1i * x0i;
        a[j2 + 1] = wk1r * x0i + wk1i * x0r;
        x0r = y1r + y3i;
        x0i = y1i + y3r;
        a[j2 + 2] = wd1r * x0r - wd1i * x0i;
        a[j2 + 3] = wd1r * x0i + wd1i * x0r;
        x0r = x1r - x3i;
        x0i = x1i - x3r;
        a[j3] = wk3r * x0r + wk3i * x0i;
        a[j3 + 1] = wk3r * x0i - wk3i * x0r;
        x0r = y1r - y3i;
        x0i = y1i - y3r;
        a[j3 + 2] = wd3r * x0r + wd3i * x0i;
        a[j3 + 3] = wd3r * x0i - wd3i * x0r;
        j0 = m - j;
        j1 = j0 + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j0] + a[j2];
        x0i = -a[j0 + 1] - a[j2 + 1];
        x1r = a[j0] - a[j2];
        x1i = -a[j0 + 1] + a[j2 + 1];
        y0r = a[j0 - 2] + a[j2 - 2];
        y0i = -a[j0 - 1] - a[j2 - 1];
        y1r = a[j0 - 2] - a[j2 - 2];
        y1i = -a[j0 - 1] + a[j2 - 1];
        x2r = a[j1] + a[j3];
        x2i = a[j1 + 1] + a[j3 + 1];
        x3r = a[j1] - a[j3];
        x3i = a[j1 + 1] - a[j3 + 1];
        y2r = a[j1 - 2] + a[j3 - 2];
        y2i = a[j1 - 1] + a[j3 - 1];
        y3r = a[j1 - 2] - a[j3 - 2];
        y3i = a[j1 - 1] - a[j3 - 1];
        a[j0] = x0r + x2r;
        a[j0 + 1] = x0i - x2i;
        a[j0 - 2] = y0r + y2r;
        a[j0 - 1] = y0i - y2i;
        a[j1] = x0r - x2r;
        a[j1 + 1] = x0i + x2i;
        a[j1 - 2] = y0r - y2r;
        a[j1 - 1] = y0i + y2i;
        x0r = x1r + x3i;
        x0i = x1i + x3r;
        a[j2] = wk1i * x0r - wk1r * x0i;
        a[j2 + 1] = wk1i * x0i + wk1r * x0r;
        x0r = y1r + y3i;
        x0i = y1i + y3r;
        a[j2 - 2] = wd1i * x0r - wd1r * x0i;
        a[j2 - 1] = wd1i * x0i + wd1r * x0r;
        x0r = x1r - x3i;
        x0i = x1i - x3r;
        a[j3] = wk3i * x0r + wk3r * x0i;
        a[j3 + 1] = wk3i * x0i - wk3r * x0r;
        x0r = y1r - y3i;
        x0i = y1i - y3r;
        a[j3 - 2] = wd3i * x0r + wd3r * x0i;
        a[j3 - 1] = wd3i * x0i - wd3r * x0r;
    }
    wk1r = csc1 * (wd1r + wn4r);
    wk1i = csc1 * (wd1i + wn4r);
    wk3r = csc3 * (wd3r - wn4r);
    wk3i = csc3 * (wd3i - wn4r);
    j0 = mh;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0 - 2] + a[j2 - 2];
    x0i = -a[j0 - 1] - a[j2 - 1];
    x1r = a[j0 - 2] - a[j2 - 2];
    x1i = -a[j0 - 1] + a[j2 - 1];
    x2r = a[j1 - 2] + a[j3 - 2];
    x2i = a[j1 - 1] + a[j3 - 1];
    x3r = a[j1 - 2] - a[j3 - 2];
    x3i = a[j1 - 1] - a[j3 - 1];
    a[j0 - 2] = x0r + x2r;
    a[j0 - 1] = x0i - x2i;
    a[j1 - 2] = x0r - x2r;
    a[j1 - 1] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2 - 2] = wk1r * x0r - wk1i * x0i;
    a[j2 - 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3 - 2] = wk3r * x0r + wk3i * x0i;
    a[j3 - 1] = wk3r * x0i - wk3i * x0r;
    x0r = a[j0] + a[j2];
    x0i = -a[j0 + 1] - a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = -a[j0 + 1] + a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i - x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wn4r * (x0r - x0i);
    a[j2 + 1] = wn4r * (x0i + x0r);
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = -wn4r * (x0r + x0i);
    a[j3 + 1] = -wn4r * (x0i - x0r);
    x0r = a[j0 + 2] + a[j2 + 2];
    x0i = -a[j0 + 3] - a[j2 + 3];
    x1r = a[j0 + 2] - a[j2 + 2];
    x1i = -a[j0 + 3] + a[j2 + 3];
    x2r = a[j1 + 2] + a[j3 + 2];
    x2i = a[j1 + 3] + a[j3 + 3];
    x3r = a[j1 + 2] - a[j3 + 2];
    x3i = a[j1 + 3] - a[j3 + 3];
    a[j0 + 2] = x0r + x2r;
    a[j0 + 3] = x0i - x2i;
    a[j1 + 2] = x0r - x2r;
    a[j1 + 3] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2 + 2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 3] = wk1i * x0i + wk1r * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3 + 2] = wk3i * x0r + wk3r * x0i;
    a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}